

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Vector<float,_2> __thiscall tcu::operator*(tcu *this,Vector<float,_3> *vec,Matrix<float,_3,_2> *mtx)

{
  Vector<float,_2> VVar1;
  float *pfVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar3;
  int local_2c;
  float local_28;
  int row;
  float v;
  int col;
  Matrix<float,_3,_2> *mtx_local;
  Vector<float,_3> *vec_local;
  Vector<float,_2> *res;
  
  Vector<float,_2>::Vector((Vector<float,_2> *)this);
  local_28 = extraout_XMM0_Da;
  fVar3 = extraout_XMM0_Db;
  for (row = 0; row < 2; row = row + 1) {
    local_28 = 0.0;
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      pfVar2 = Matrix<float,_3,_2>::operator()(mtx,local_2c,row);
      local_28 = *pfVar2 * vec->m_data[local_2c] + local_28;
    }
    fVar3 = 0.0;
    *(float *)(this + (long)row * 4) = local_28;
  }
  VVar1.m_data[1] = fVar3;
  VVar1.m_data[0] = local_28;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

Vector<T, Cols> operator* (const Vector<T, Rows>& vec, const Matrix<T, Rows, Cols>& mtx)
{
	Vector<T, Cols> res;
	for (int col = 0; col < Cols; col++)
	{
		T v = T(0);
		for (int row = 0; row < Rows; row++)
			v += mtx(row,col) * vec.m_data[row];
		res.m_data[col] = v;
	}
	return res;
}